

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O3

void anon_unknown.dwarf_1913a4::ReverbState::DoMixRow
               (span<float,_18446744073709551615UL> OutBuffer,
               span<const_float,_18446744073709551615UL> Gains,float *InSamples,size_t InStride)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *__s;
  iterator __begin2;
  iterator __end2;
  
  pfVar4 = Gains.mData;
  pfVar5 = OutBuffer.mDataEnd;
  __s = OutBuffer.mData;
  if (__s != pfVar5) {
    memset(__s,0,((long)pfVar5 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  for (; pfVar4 != Gains.mDataEnd; pfVar4 = pfVar4 + 1) {
    fVar2 = *pfVar4;
    if (1e-05 < ABS(fVar2) && __s != pfVar5) {
      lVar3 = 0;
      do {
        pfVar1 = (float *)(lVar3 + (long)__s);
        *pfVar1 = *(float *)((long)InSamples + lVar3) * fVar2 + *pfVar1;
        lVar3 = lVar3 + 4;
      } while (pfVar1 + 1 != pfVar5);
    }
    InSamples = InSamples + InStride;
  }
  return;
}

Assistant:

static void DoMixRow(const al::span<float> OutBuffer, const al::span<const float> Gains,
        const float *InSamples, const size_t InStride)
    {
        std::fill(OutBuffer.begin(), OutBuffer.end(), 0.0f);
        for(const float gain : Gains)
        {
            const float *RESTRICT input{al::assume_aligned<16>(InSamples)};
            InSamples += InStride;

            if(!(std::fabs(gain) > GainSilenceThreshold))
                continue;

            for(float &sample : OutBuffer)
            {
                sample += *input * gain;
                ++input;
            }
        }
    }